

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O2

void TTD::NSSnapObjects::EmitAddtlInfo_SnapPromiseAllResolveElementFunctionInfo
               (SnapObject *snpObject,FileWriter *writer)

{
  SnapPromiseAllResolveElementFunctionInfo *capabilityInfo;
  
  capabilityInfo =
       SnapObjectGetAddtlInfoAs<TTD::NSSnapObjects::SnapPromiseAllResolveElementFunctionInfo*,(TTD::NSSnapObjects::SnapObjectType)31>
                 (snpObject);
  (*writer->_vptr_FileWriter[3])(writer,3,1);
  NSSnapValues::EmitPromiseCapabilityInfo(&capabilityInfo->Capabilities,writer,NoSeparator);
  FileWriter::WriteUInt32(writer,u32Val,capabilityInfo->Index,CommaSeparator);
  FileWriter::WriteAddr(writer,ptrIdVal,capabilityInfo->RemainingElementsWrapperId,CommaSeparator);
  FileWriter::WriteUInt32(writer,u32Val,capabilityInfo->RemainingElementsValue,CommaSeparator);
  FileWriter::WriteAddr(writer,ptrIdVal,capabilityInfo->Values,CommaSeparator);
  (*writer->_vptr_FileWriter[0xc])(writer,10,(ulong)capabilityInfo->AlreadyCalled,1);
  return;
}

Assistant:

void EmitAddtlInfo_SnapPromiseAllResolveElementFunctionInfo(const SnapObject* snpObject, FileWriter* writer)
        {
            SnapPromiseAllResolveElementFunctionInfo* aInfo = SnapObjectGetAddtlInfoAs<SnapPromiseAllResolveElementFunctionInfo*, SnapObjectType::SnapPromiseAllResolveElementFunctionObject>(snpObject);

            writer->WriteKey(NSTokens::Key::entry, NSTokens::Separator::CommaSeparator);
            NSSnapValues::EmitPromiseCapabilityInfo(&aInfo->Capabilities, writer, NSTokens::Separator::NoSeparator);

            writer->WriteUInt32(NSTokens::Key::u32Val, aInfo->Index, NSTokens::Separator::CommaSeparator);
            writer->WriteAddr(NSTokens::Key::ptrIdVal, aInfo->RemainingElementsWrapperId, NSTokens::Separator::CommaSeparator);
            writer->WriteUInt32(NSTokens::Key::u32Val, aInfo->RemainingElementsValue, NSTokens::Separator::CommaSeparator);

            writer->WriteAddr(NSTokens::Key::ptrIdVal, aInfo->Values, NSTokens::Separator::CommaSeparator);

            writer->WriteBool(NSTokens::Key::boolVal, aInfo->AlreadyCalled, NSTokens::Separator::CommaSeparator);
        }